

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O3

QDBusMenuItemList * __thiscall
QDBusMenuAdaptor::GetGroupProperties
          (QDBusMenuItemList *__return_storage_ptr__,QDBusMenuAdaptor *this,QList<int> *ids,
          QStringList *propertyNames)

{
  QDebug this_00;
  QLoggingCategory *pQVar1;
  Stream *__old_val;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QtPrivate local_60 [8];
  QArrayDataPointer<QDBusMenuItem> local_58;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    local_58.d = (Data *)local_80.stream;
    local_80.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<int>>
              ((QtPrivate *)&local_78,(Stream *)&local_58,"QList",ids);
    QDebug::~QDebug((QDebug *)&local_58);
    local_58.d = (Data *)local_78.stream;
    local_78.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QString>>
              ((QtPrivate *)&local_70,(Stream *)&local_58,"QList",propertyNames);
    QDebug::~QDebug((QDebug *)&local_58);
    this_00.stream = local_70.stream;
    QVar2.m_data = (storage_type *)0x2;
    QVar2.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)&local_58);
    if ((Stream *)local_58.d != (Stream *)0x0) {
      LOCK();
      *(int *)local_58.d = *(int *)local_58.d + -1;
      UNLOCK();
      if (*(int *)local_58.d == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    (local_70.stream)->ref = (local_70.stream)->ref + 1;
    QDBusMenuItem::items((QDBusMenuItemList *)&local_58,ids,propertyNames);
    local_68.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QDBusMenuItem>>
              (local_60,(Stream *)local_40,"QList",(QList<QDBusMenuItem> *)&local_58);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)local_60);
    QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&local_58);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
  }
  QDBusMenuItem::items(__return_storage_ptr__,ids,propertyNames);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMenuItemList QDBusMenuAdaptor::GetGroupProperties(const QList<int> &ids, const QStringList &propertyNames)
{
    qCDebug(qLcMenu) << ids << propertyNames << "=>" << QDBusMenuItem::items(ids, propertyNames);
    return QDBusMenuItem::items(ids, propertyNames);
}